

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O3

int secp256k1_der_read_len(size_t *len,uchar **sigp,uchar *sigend)

{
  byte *pbVar1;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  byte *pbVar7;
  uchar *sigend_00;
  uchar *puVar8;
  uint uVar9;
  ulong uVar11;
  ulong uStack_60;
  int iStack_54;
  uchar auStack_50 [40];
  ulong uVar10;
  
  if (len != (size_t *)0x0) {
    *len = 0;
    pbVar7 = *sigp;
    uVar4 = 0;
    if (pbVar7 < sigend) {
      pbVar1 = pbVar7 + 1;
      *sigp = pbVar1;
      bVar2 = *pbVar7;
      if ((ulong)bVar2 != 0xff) {
        if ((char)bVar2 < '\0') {
          if (bVar2 != 0x80) {
            uVar9 = bVar2 & 0x7f;
            uVar10 = (ulong)uVar9;
            if (((uVar10 <= (ulong)((long)sigend - (long)pbVar1)) && ((byte)uVar9 < 9)) &&
               (*pbVar1 != 0)) {
              if (uVar10 == 0) {
                uVar11 = 0;
              }
              else {
                pbVar7 = pbVar7 + 2;
                uVar6 = 0;
                uVar11 = 0;
                do {
                  uVar11 = (ulong)pbVar7[-1] | uVar11 << 8;
                  *len = uVar11;
                  *sigp = pbVar7;
                  pbVar7 = pbVar7 + 1;
                  uVar6 = uVar6 + 1;
                } while (uVar10 != uVar6);
                if (((long)sigend - (long)pbVar1) - uVar6 < uVar11) {
                  return 0;
                }
              }
              uVar4 = (uint)(0x7f < uVar11);
            }
          }
        }
        else {
          *len = (ulong)bVar2;
          uVar4 = 1;
        }
      }
    }
    return uVar4;
  }
  secp256k1_der_read_len_cold_1();
  iStack_54 = 0;
  auStack_50[0x10] = '\0';
  auStack_50[0x11] = '\0';
  auStack_50[0x12] = '\0';
  auStack_50[0x13] = '\0';
  auStack_50[0x14] = '\0';
  auStack_50[0x15] = '\0';
  auStack_50[0x16] = '\0';
  auStack_50[0x17] = '\0';
  auStack_50[0x18] = '\0';
  auStack_50[0x19] = '\0';
  auStack_50[0x1a] = '\0';
  auStack_50[0x1b] = '\0';
  auStack_50[0x1c] = '\0';
  auStack_50[0x1d] = '\0';
  auStack_50[0x1e] = '\0';
  auStack_50[0x1f] = '\0';
  auStack_50[0] = '\0';
  auStack_50[1] = '\0';
  auStack_50[2] = '\0';
  auStack_50[3] = '\0';
  auStack_50[4] = '\0';
  auStack_50[5] = '\0';
  auStack_50[6] = '\0';
  auStack_50[7] = '\0';
  auStack_50[8] = '\0';
  auStack_50[9] = '\0';
  auStack_50[10] = '\0';
  auStack_50[0xb] = '\0';
  auStack_50[0xc] = '\0';
  auStack_50[0xd] = '\0';
  auStack_50[0xe] = '\0';
  auStack_50[0xf] = '\0';
  puVar8 = *sigp;
  if (puVar8 == sigend_00) {
    return 0;
  }
  if (*puVar8 != '\x02') {
    return 0;
  }
  *sigp = puVar8 + 1;
  iVar5 = secp256k1_der_read_len(&uStack_60,sigp,sigend_00);
  if (iVar5 == 0) {
    return 0;
  }
  if (uStack_60 == 0) {
    return 0;
  }
  puVar8 = *sigp;
  if ((ulong)((long)sigend_00 - (long)puVar8) < uStack_60) {
    return 0;
  }
  uVar3 = *puVar8;
  if (uStack_60 == 1 || uVar3 != '\0') {
    if (uVar3 == 0xff && uStack_60 != 1) {
      if ((char)puVar8[1] < '\0') {
        return 0;
      }
    }
    else if (-1 < (char)uVar3) {
      if (uVar3 == '\0') goto LAB_0011726d;
      goto LAB_0011727a;
    }
  }
  else {
    if (-1 < (char)puVar8[1]) {
      return 0;
    }
LAB_0011726d:
    uStack_60 = uStack_60 - 1;
    puVar8 = puVar8 + 1;
    *sigp = puVar8;
LAB_0011727a:
    if (uStack_60 < 0x21) {
      if (uStack_60 != 0) {
        memcpy(auStack_50 + (0x20 - uStack_60),puVar8,uStack_60);
      }
      secp256k1_scalar_set_b32((secp256k1_scalar *)len,auStack_50,&iStack_54);
      if (iStack_54 == 0) goto LAB_001172b8;
    }
  }
  *(undefined4 *)len = 0;
LAB_001172b8:
  *sigp = *sigp + uStack_60;
  return 1;
}

Assistant:

static int secp256k1_der_read_len(size_t *len, const unsigned char **sigp, const unsigned char *sigend) {
    size_t lenleft;
    unsigned char b1;
    VERIFY_CHECK(len != NULL);
    *len = 0;
    if (*sigp >= sigend) {
        return 0;
    }
    b1 = *((*sigp)++);
    if (b1 == 0xFF) {
        /* X.690-0207 8.1.3.5.c the value 0xFF shall not be used. */
        return 0;
    }
    if ((b1 & 0x80) == 0) {
        /* X.690-0207 8.1.3.4 short form length octets */
        *len = b1;
        return 1;
    }
    if (b1 == 0x80) {
        /* Indefinite length is not allowed in DER. */
        return 0;
    }
    /* X.690-207 8.1.3.5 long form length octets */
    lenleft = b1 & 0x7F; /* lenleft is at least 1 */
    if (lenleft > (size_t)(sigend - *sigp)) {
        return 0;
    }
    if (**sigp == 0) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    if (lenleft > sizeof(size_t)) {
        /* The resulting length would exceed the range of a size_t, so
         * it is certainly longer than the passed array size. */
        return 0;
    }
    while (lenleft > 0) {
        *len = (*len << 8) | **sigp;
        (*sigp)++;
        lenleft--;
    }
    if (*len > (size_t)(sigend - *sigp)) {
        /* Result exceeds the length of the passed array.
           (Checking this is the responsibility of the caller but it
           can't hurt do it here, too.) */
        return 0;
    }
    if (*len < 128) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    return 1;
}